

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O2

PCRE2_SPTR8 get_chr_property_list(PCRE2_SPTR8 code,BOOL utf,uint8_t *fcc,uint32_t *list)

{
  int iVar1;
  PCRE2_UCHAR8 PVar2;
  uint uVar3;
  ushort *puVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  ushort *puVar12;
  
  bVar5 = *code;
  uVar6 = (uint)bVar5;
  *list = (uint)bVar5;
  list[1] = 0;
  puVar12 = (ushort *)(code + 1);
  if (0x40 < (byte)(bVar5 - 0x21)) goto LAB_0012140c;
  PVar2 = get_repeat_base(bVar5);
  bVar5 = (bVar5 - PVar2) + 0x21;
  if ((bVar5 < 0x2e) && ((0x238000000000U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) {
    puVar12 = (ushort *)(code + 3);
  }
  if ((0x29 < bVar5) || (uVar11 = 0, (0x21800000000U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) {
    uVar11 = (uint32_t)(bVar5 != 0x2b);
  }
  list[1] = uVar11;
  uVar11 = 0x1d;
  if (PVar2 == '!') {
LAB_001213f3:
    *list = uVar11;
    puVar4 = puVar12;
switchD_00121426_caseD_1d:
    puVar12 = (ushort *)((long)puVar4 + 1);
    bVar5 = (byte)*puVar4;
    uVar6 = (uint)bVar5;
    if ((utf != 0) && (0xbf < bVar5)) {
      if ((bVar5 & 0x20) == 0) {
        puVar12 = puVar4 + 1;
        uVar6 = (bVar5 & 0x1f) << 6 | *(byte *)((long)puVar4 + 1) & 0x3f;
      }
      else {
        uVar3 = *(byte *)puVar12 & 0x3f;
        if ((bVar5 & 0x10) == 0) {
          uVar6 = (byte)puVar4[1] & 0x3f | uVar3 << 6 | (uVar6 & 0xf) << 0xc;
          puVar12 = (ushort *)((long)puVar4 + 3);
        }
        else if ((bVar5 & 8) == 0) {
          uVar6 = *(byte *)((long)puVar4 + 3) & 0x3f |
                  ((byte)puVar4[1] & 0x3f) << 6 | uVar3 << 0xc | (uVar6 & 7) << 0x12;
          puVar12 = puVar4 + 2;
        }
        else {
          uVar10 = (byte)puVar4[1] & 0x3f;
          uVar7 = *(byte *)((long)puVar4 + 3) & 0x3f;
          uVar9 = (byte)puVar4[2] & 0x3f;
          if ((bVar5 & 4) == 0) {
            uVar6 = uVar7 << 6 | uVar10 << 0xc | uVar3 << 0x12 | (uVar6 & 3) << 0x18 | uVar9;
            puVar12 = (ushort *)((long)puVar4 + 5);
          }
          else {
            uVar6 = *(byte *)((long)puVar4 + 5) & 0x3f |
                    uVar9 << 6 | uVar7 << 0xc | uVar10 << 0x12 | uVar3 << 0x18 | (uVar6 & 1) << 0x1e
            ;
            puVar12 = puVar4 + 3;
          }
        }
      }
    }
    list[2] = uVar6;
    goto LAB_001217ec;
  }
  puVar4 = puVar12;
  if (PVar2 == '.') goto switchD_00121426_caseD_20;
  if (PVar2 == 'U') {
    uVar6 = (uint)(byte)*puVar12;
    *list = (uint)(byte)*puVar12;
    puVar12 = (ushort *)((long)puVar12 + 1);
  }
  else {
    uVar11 = 0x1f;
    if (PVar2 == 'H') goto switchD_00121426_caseD_20;
    if (PVar2 == ';') {
      uVar11 = 0x1f;
      goto LAB_001213f3;
    }
  }
LAB_0012140c:
  uVar11 = 0x1f;
  puVar4 = puVar12;
  switch(uVar6) {
  case 0xe:
  case 0x1b:
  case 0x1c:
    return (PCRE2_SPTR8)0x0;
  case 0xf:
  case 0x10:
    if ((byte)*puVar12 == 9) {
      bVar5 = *(byte *)((long)puVar12 + 1);
      uVar8 = 8;
      do {
        if (0x1f < uVar8) {
          list[2] = (uint)(byte)puVar12[1];
          list[3] = (uint)*(byte *)((long)puVar12 + 3);
          return (PCRE2_SPTR8)(puVar12 + 1);
        }
        iVar1 = *(int *)(&UNK_00127ed8 + uVar8 + (ulong)bVar5 * 4);
        *(int *)((long)list + uVar8) = iVar1;
        uVar8 = uVar8 + 4;
      } while (iVar1 != -1);
      *list = (uint)((char)uVar6 != '\x10') * 2 + 0x1d;
      return (PCRE2_SPTR8)(puVar12 + 1);
    }
    list[2] = (uint)(byte)*puVar12;
    list[3] = (uint)*(byte *)((long)puVar12 + 1);
    puVar12 = puVar12 + 1;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
    break;
  case 0x1d:
  case 0x1f:
    goto switchD_00121426_caseD_1d;
  case 0x1e:
    uVar11 = 0x1d;
  case 0x20:
switchD_00121426_caseD_20:
    *list = uVar11;
    puVar12 = (ushort *)((long)puVar4 + 1);
    bVar5 = (byte)*puVar4;
    uVar6 = (uint)bVar5;
    if (0xbf < bVar5 && utf != 0) {
      if ((bVar5 & 0x20) == 0) {
        puVar12 = puVar4 + 1;
        uVar6 = (bVar5 & 0x1f) << 6 | *(byte *)((long)puVar4 + 1) & 0x3f;
      }
      else {
        uVar3 = *(byte *)puVar12 & 0x3f;
        if ((bVar5 & 0x10) == 0) {
          uVar6 = (byte)puVar4[1] & 0x3f | uVar3 << 6 | (uVar6 & 0xf) << 0xc;
          puVar12 = (ushort *)((long)puVar4 + 3);
        }
        else if ((bVar5 & 8) == 0) {
          uVar6 = *(byte *)((long)puVar4 + 3) & 0x3f |
                  ((byte)puVar4[1] & 0x3f) << 6 | uVar3 << 0xc | (uVar6 & 7) << 0x12;
          puVar12 = puVar4 + 2;
        }
        else {
          uVar9 = (byte)puVar4[1] & 0x3f;
          uVar7 = *(byte *)((long)puVar4 + 3) & 0x3f;
          uVar10 = (byte)puVar4[2] & 0x3f;
          if ((bVar5 & 4) == 0) {
            uVar6 = uVar7 << 6 | uVar9 << 0xc | uVar3 << 0x12 | (uVar6 & 3) << 0x18 | uVar10;
            puVar12 = (ushort *)((long)puVar4 + 5);
          }
          else {
            uVar6 = *(byte *)((long)puVar4 + 5) & 0x3f |
                    uVar10 << 6 | uVar7 << 0xc | uVar9 << 0x12 | uVar3 << 0x18 | (uVar6 & 1) << 0x1e
            ;
            puVar12 = puVar4 + 3;
          }
        }
      }
    }
    list[2] = uVar6;
    if ((uVar6 < 0x80) || (utf == 0 && uVar6 < 0x100)) {
      uVar3 = (uint)fcc[uVar6];
    }
    else {
      uVar3 = _pcre2_ucd_records_8
              [*(ushort *)
                ((long)_pcre2_ucd_stage2_8 +
                (ulong)((uint)""[uVar6 >> 7] * 0x100 + (uVar6 & 0x7f) * 2))].other_case + uVar6;
    }
    list[3] = uVar3;
    if (uVar6 == uVar3) {
LAB_001217ec:
      list[3] = 0xffffffff;
    }
    else {
      list[4] = 0xffffffff;
    }
    break;
  default:
    if (uVar6 - 0x6e < 2) {
      puVar4 = puVar12 + 0x10;
    }
    else {
      if (uVar6 != 0x70) {
        return (PCRE2_SPTR8)0x0;
      }
      puVar4 = (ushort *)((long)puVar12 + ((ulong)(ushort)(*puVar12 << 8 | *puVar12 >> 8) - 1));
    }
    uVar6 = (byte)*puVar4 - 0x62;
    if (uVar6 < 0xc) {
      if ((0x533U >> (uVar6 & 0x1f) & 1) == 0) {
        if ((0x20cU >> (uVar6 & 0x1f) & 1) == 0) {
          list[1] = (uint)((*(ushort *)((long)puVar4 + 1) & 0xff) == 0 &&
                          *(ushort *)((long)puVar4 + 1) >> 8 == 0);
          puVar4 = (ushort *)((long)puVar4 + 5);
          goto LAB_0012166e;
        }
      }
      else {
        list[1] = 1;
      }
      puVar4 = (ushort *)((long)puVar4 + 1);
    }
LAB_0012166e:
    list[2] = (int)puVar4 - (int)puVar12;
    return (PCRE2_SPTR8)puVar4;
  }
  return (PCRE2_SPTR8)puVar12;
}

Assistant:

static PCRE2_SPTR
get_chr_property_list(PCRE2_SPTR code, BOOL utf, const uint8_t *fcc,
  uint32_t *list)
{
PCRE2_UCHAR c = *code;
PCRE2_UCHAR base;
PCRE2_SPTR end;
uint32_t chr;

#ifdef SUPPORT_UNICODE
uint32_t *clist_dest;
const uint32_t *clist_src;
#else
(void)utf;    /* Suppress "unused parameter" compiler warning */
#endif

list[0] = c;
list[1] = FALSE;
code++;

if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
  {
  base = get_repeat_base(c);
  c -= (base - OP_STAR);

  if (c == OP_UPTO || c == OP_MINUPTO || c == OP_EXACT || c == OP_POSUPTO)
    code += IMM2_SIZE;

  list[1] = (c != OP_PLUS && c != OP_MINPLUS && c != OP_EXACT &&
             c != OP_POSPLUS);

  switch(base)
    {
    case OP_STAR:
    list[0] = OP_CHAR;
    break;

    case OP_STARI:
    list[0] = OP_CHARI;
    break;

    case OP_NOTSTAR:
    list[0] = OP_NOT;
    break;

    case OP_NOTSTARI:
    list[0] = OP_NOTI;
    break;

    case OP_TYPESTAR:
    list[0] = *code;
    code++;
    break;
    }
  c = list[0];
  }

switch(c)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  case OP_ANY:
  case OP_ALLANY:
  case OP_ANYNL:
  case OP_NOT_HSPACE:
  case OP_HSPACE:
  case OP_NOT_VSPACE:
  case OP_VSPACE:
  case OP_EXTUNI:
  case OP_EODN:
  case OP_EOD:
  case OP_DOLL:
  case OP_DOLLM:
  return code;

  case OP_CHAR:
  case OP_NOT:
  GETCHARINCTEST(chr, code);
  list[2] = chr;
  list[3] = NOTACHAR;
  return code;

  case OP_CHARI:
  case OP_NOTI:
  list[0] = (c == OP_CHARI) ? OP_CHAR : OP_NOT;
  GETCHARINCTEST(chr, code);
  list[2] = chr;

#ifdef SUPPORT_UNICODE
  if (chr < 128 || (chr < 256 && !utf))
    list[3] = fcc[chr];
  else
    list[3] = UCD_OTHERCASE(chr);
#elif defined SUPPORT_WIDE_CHARS
  list[3] = (chr < 256) ? fcc[chr] : chr;
#else
  list[3] = fcc[chr];
#endif

  /* The othercase might be the same value. */

  if (chr == list[3])
    list[3] = NOTACHAR;
  else
    list[4] = NOTACHAR;
  return code;

#ifdef SUPPORT_UNICODE
  case OP_PROP:
  case OP_NOTPROP:
  if (code[0] != PT_CLIST)
    {
    list[2] = code[0];
    list[3] = code[1];
    return code + 2;
    }

  /* Convert only if we have enough space. */

  clist_src = PRIV(ucd_caseless_sets) + code[1];
  clist_dest = list + 2;
  code += 2;

  do {
     if (clist_dest >= list + 8)
       {
       /* Early return if there is not enough space. This should never
       happen, since all clists are shorter than 5 character now. */
       list[2] = code[0];
       list[3] = code[1];
       return code;
       }
     *clist_dest++ = *clist_src;
     }
  while(*clist_src++ != NOTACHAR);

  /* All characters are stored. The terminating NOTACHAR is copied from the
  clist itself. */

  list[0] = (c == OP_PROP) ? OP_CHAR : OP_NOT;
  return code;
#endif

  case OP_NCLASS:
  case OP_CLASS:
#ifdef SUPPORT_WIDE_CHARS
  case OP_XCLASS:
  if (c == OP_XCLASS)
    end = code + GET(code, 0) - 1;
  else
#endif
    end = code + 32 / sizeof(PCRE2_UCHAR);

  switch(*end)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRQUERY:
    case OP_CRMINQUERY:
    case OP_CRPOSSTAR:
    case OP_CRPOSQUERY:
    list[1] = TRUE;
    end++;
    break;

    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSPLUS:
    end++;
    break;

    case OP_CRRANGE:
    case OP_CRMINRANGE:
    case OP_CRPOSRANGE:
    list[1] = (GET2(end, 1) == 0);
    end += 1 + 2 * IMM2_SIZE;
    break;
    }
  list[2] = (uint32_t)(end - code);
  return end;
  }
return NULL;    /* Opcode not accepted */
}